

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r7pfr.cpp
# Opt level: O2

int solver_R7Pfr(Matrix<double,_35,_1,_0,_35,_1> *data,
                Matrix<std::complex<double>,_4,_10,_0,_4,_10> *sols)

{
  double dVar1;
  double dVar2;
  short *psVar3;
  long lVar4;
  int *piVar5;
  CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  *src;
  int i;
  complex<double> *pcVar6;
  Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false> local_3f40;
  EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> eig;
  undefined1 local_3e28 [16];
  scalar_constant_op<double> local_3e18;
  RhsNested local_3e10;
  variable_if_dynamic<long,__1> vStack_3e08;
  Index local_3e00;
  complex<double> *local_3df8;
  Matrix<std::complex<double>,_4,_10,_0,_4,_10> *local_3de8;
  undefined8 local_3de0;
  undefined8 local_3dd8;
  undefined8 local_3dd0;
  undefined8 local_3dc0;
  CommaInitializer<Eigen::Block<Eigen::Matrix<std::complex<double>,4,10,0,4,10>,1,10,false>>
  local_3da8 [32];
  CommaInitializer<Eigen::Block<Eigen::Matrix<std::complex<double>,4,10,0,4,10>,1,10,false>>
  local_3d88 [32];
  CommaInitializer<Eigen::Block<Eigen::Matrix<std::complex<double>,4,10,0,4,10>,1,10,false>>
  local_3d68 [32];
  CommaInitializer<Eigen::Block<Eigen::Matrix<std::complex<double>,4,10,0,4,10>,1,10,false>>
  local_3d48 [32];
  Matrix<std::complex<double>,_10,_1,_0,_10,_1> scale;
  Matrix<std::complex<double>,_10,_10,_0,_10,_10> V;
  Matrix<std::complex<double>,_10,_1,_0,_10,_1> D;
  Matrix<double,_10,_10,_0,_10,_10> AM;
  Matrix<double,_17,_10,_0,_17,_10> RR;
  Matrix<double,_26,_10,_0,_26,_10> C1;
  Matrix<double,_26,_26,_0,_26,_26> C0;
  
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[3]._M_value._8_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [0];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[2]._M_value._8_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [2];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[4]._M_value._0_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [3];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[7]._M_value._0_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [7];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[6]._M_value._0_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [8];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[9]._M_value._0_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [0xd];
  dVar1 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.
          array[0x11];
  dVar2 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.
          array[0x14];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0xb]._M_value._0_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [0x15];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0xe]._M_value._8_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [0x1c];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0]._M_value._0_8_ =
       (ulong)(data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
              m_data.array[0xf] ^ 0x8000000000000000;
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0]._M_value._8_8_ =
       (ulong)(data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
              m_data.array[0x10] ^ 0x8000000000000000;
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[1]._M_value._0_8_ =
       -(data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.
        array[0xe];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[1]._M_value._8_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [1] - dVar1;
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[2]._M_value._0_8_ =
       -(data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.
        array[0x12];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[3]._M_value._0_8_ =
       -(data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.
        array[0x13];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[4]._M_value._8_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [4] - dVar2;
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[5]._M_value._0_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [5];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[5]._M_value._8_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [6];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[6]._M_value._8_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [9] - dVar1;
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[7]._M_value._8_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [10];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[8]._M_value._0_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [0xb];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[8]._M_value._8_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [0xc] - dVar2;
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[9]._M_value._8_8_ = 0x3ff0000000000000;
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[10]._M_value._0_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [0x16];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[10]._M_value._8_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [0x17];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0xb]._M_value._8_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [0x18];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0xc]._M_value._0_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [0x19];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0xc]._M_value._8_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [0x1a];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0xd]._M_value._0_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [0x1b];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0xd]._M_value._8_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [0x1d];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0xe]._M_value._0_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [0x1e];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0xf]._M_value._0_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [0x1f];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0xf]._M_value._8_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [0x20];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x10]._M_value._0_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [0x21];
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x10]._M_value._8_8_ =
       (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.array
       [0x22];
  memset(&C0,0,0x1520);
  memset(&C1,0,0x820);
  psVar3 = &setup_elimination_template(Eigen::Matrix<double,int,int,int,int,int>,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
            ::iv0;
  for (lVar4 = 0; lVar4 != 0x97; lVar4 = lVar4 + 1) {
    C0.super_PlainObjectBase<Eigen::Matrix<double,_26,_26,_0,_26,_26>_>.m_storage.m_data.array
    [*psVar3] = *(double *)
                 (V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.
                  m_storage.m_data.array[0]._M_value +
                 (long)(char)(&setup_elimination_template(Eigen::Matrix<double,int,int,int,int,int>,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
                               ::iv1)[lVar4] * 8);
    psVar3 = psVar3 + 1;
  }
  for (lVar4 = 0; lVar4 != 0x57; lVar4 = lVar4 + 1) {
    C1.super_PlainObjectBase<Eigen::Matrix<double,_26,_10,_0,_26,_10>_>.m_storage.m_data.array
    [(byte)(&setup_elimination_template(Eigen::Matrix<double,int,int,int,int,int>,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
             ::uv0)[lVar4]] =
         *(double *)
          (V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.
           m_storage.m_data.array[0]._M_value +
          (long)(char)(&setup_elimination_template(Eigen::Matrix<double,int,int,int,int,int>,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
                        ::iv2)[lVar4] * 8);
  }
  Eigen::PartialPivLU<Eigen::Matrix<double,26,26,0,26,26>>::
  PartialPivLU<Eigen::Matrix<double,26,26,0,26,26>>
            ((PartialPivLU<Eigen::Matrix<double,_26,_26,_0,_26,_26>_> *)&V,
             (EigenBase<Eigen::Matrix<double,_26,_26,_0,_26,_26>_> *)&C0);
  RR.super_PlainObjectBase<Eigen::Matrix<double,_17,_10,_0,_17,_10>_>.m_storage.m_data.array[0] =
       (double)&V;
  RR.super_PlainObjectBase<Eigen::Matrix<double,_17,_10,_0,_17,_10>_>.m_storage.m_data.array[1] =
       (double)&C1;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,26,10,0,26,10>,Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<double,26,26,0,26,26>>,Eigen::Matrix<double,26,10,0,26,10>>>
            (&C1,(Solve<Eigen::PartialPivLU<Eigen::Matrix<double,_26,_26,_0,_26,_26>_>,_Eigen::Matrix<double,_26,_10,_0,_26,_10>_>
                  *)&RR);
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0]._M_value._0_8_ =
       C1.super_PlainObjectBase<Eigen::Matrix<double,_26,_10,_0,_26,_10>_>.m_storage.m_data.array +
       0x13;
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0]._M_value._8_8_ = 7;
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[2]._M_value._0_8_ = 0x13;
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[2]._M_value._8_8_ = 0;
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[3]._M_value._0_8_ = 0x1a;
  AM.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array[1] =
       3.45845952088873e-323;
  AM.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array[4] =
       0.0;
  AM.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array[5] =
       0.0;
  AM.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array[6] =
       8.39911597930119e-323;
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[1]._M_value._8_8_ = &C1;
  AM.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array[0] =
       (double)&RR;
  AM.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array[3] =
       (double)&RR;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,17,10,0,17,10>,_1,10,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,26,10,0,26,10>,_1,10,false>const>>
            ((Block<Eigen::Matrix<double,_17,_10,_0,_17,_10>,__1,_10,_false> *)&AM,
             (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_26,_10,_0,_26,_10>,__1,_10,_false>_>
              *)&V);
  AM.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array[0] =
       4.94065645841247e-323;
  AM.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array[1] =
       4.94065645841247e-323;
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0]._M_value._0_8_ =
       RR.super_PlainObjectBase<Eigen::Matrix<double,_17,_10,_0,_17,_10>_>.m_storage.m_data.array +
       7;
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0]._M_value._8_8_ = 10;
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[2]._M_value._0_8_ = 7;
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[2]._M_value._8_8_ = 0;
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[3]._M_value._0_8_ = 0x11;
  src = (CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
         *)&AM;
  V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[1]._M_value._8_8_ =
       (Solve<Eigen::PartialPivLU<Eigen::Matrix<double,_26,_26,_0,_26,_26>_>,_Eigen::Matrix<double,_26,_10,_0,_26,_10>_>
        *)&RR;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,17,10,0,17,10>,_1,10,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Block<Eigen::Matrix<double,_17,_10,_0,_17,_10>,__1,_10,_false> *)&V,src);
  piVar5 = &DAT_001f66f0;
  for (pcVar6 = (complex<double> *)0x0; pcVar6 != (complex<double> *)0xa;
      pcVar6 = (complex<double> *)(pcVar6->_M_value + 1)) {
    V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.
    m_data.array[1]._M_value._8_8_ = SEXT48(*piVar5);
    V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.
    m_data.array[0]._M_value._0_8_ =
         RR.super_PlainObjectBase<Eigen::Matrix<double,_17,_10,_0,_17,_10>_>.m_storage.m_data.array
         + V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.
           m_storage.m_data.array[1]._M_value._8_8_;
    V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.
    m_data.array[2]._M_value._0_8_ = 0;
    V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.
    m_data.array[2]._M_value._8_8_ = 1;
    eig.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.
    m_storage.m_rows = 0;
    eig.m_isInitialized = true;
    eig.m_eigenvectorsOk = false;
    eig._42_2_ = 0;
    eig.m_info = Success;
    eig.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)src;
    eig.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         (Index)&AM;
    eig.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.
    m_storage.m_data = pcVar6;
    V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.
    m_data.array[1]._M_value._0_8_ =
         (Solve<Eigen::PartialPivLU<Eigen::Matrix<double,_26,_26,_0,_26,_26>_>,_Eigen::Matrix<double,_26,_10,_0,_26,_10>_>
          *)&RR;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,10,10,0,10,10>,1,10,false>,Eigen::Block<Eigen::Matrix<double,17,10,0,17,10>,1,10,false>>
              ((Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_10,_false> *)&eig,
               (Block<Eigen::Matrix<double,_17,_10,_0,_17,_10>,_1,_10,_false> *)&V);
    piVar5 = piVar5 + 1;
    src = (CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           *)&src->m_cols;
  }
  Eigen::EigenSolver<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  EigenSolver<Eigen::Matrix<double,10,10,0,10,10>>
            ((EigenSolver<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&eig,
             (EigenBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)&AM,true);
  Eigen::PlainObjectBase<Eigen::Matrix<std::complex<double>,10,1,0,10,1>>::
  PlainObjectBase<Eigen::Matrix<std::complex<double>,_1,1,0,_1,1>>
            ((PlainObjectBase<Eigen::Matrix<std::complex<double>,10,1,0,10,1>> *)&D,
             (DenseBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_> *)&eig.m_eivalues);
  Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::eigenvectors
            ((EigenvectorsType *)&scale,&eig);
  Eigen::PlainObjectBase<Eigen::Matrix<std::complex<double>,10,10,0,10,10>>::
  PlainObjectBase<Eigen::Matrix<std::complex<double>,_1,_1,0,_1,_1>>
            ((PlainObjectBase<Eigen::Matrix<std::complex<double>,10,10,0,10,10>> *)&V,
             (DenseBase<Eigen::Matrix<std::complex<double>,__1,__1,_0,__1,__1>_> *)&scale);
  free((void *)scale.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_1,_0,_10,_1>_>.
               m_storage.m_data.array[0]._M_value._0_8_);
  local_3e28._8_8_ =
       V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.
       m_data.array + 9;
  vStack_3e08.m_value = 9;
  local_3e00 = 0;
  local_3df8 = (complex<double> *)0x1;
  local_3e28._0_8_ = (PlainObjectBase<Eigen::Matrix<std::complex<double>,10,1,0,10,1>> *)&D;
  local_3e10.m_matrix = (non_const_type)&V;
  Eigen::PlainObjectBase<Eigen::Matrix<std::complex<double>,10,1,0,10,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,std::complex<double>>,Eigen::ArrayWrapper<Eigen::Matrix<std::complex<double>,10,1,0,10,1>>const,Eigen::Transpose<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<std::complex<double>,10,10,0,10,10>,1,10,false>>>const>>
            ((PlainObjectBase<Eigen::Matrix<std::complex<double>,10,1,0,10,1>> *)&scale,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,_std::complex<double>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<std::complex<double>,_10,_1,_0,_10,_1>_>,_const_Eigen::Transpose<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>,_1,_10,_false>_>_>_>_>
              *)local_3e28);
  local_3e18.m_other = 1.0;
  local_3e28._0_8_ = (PlainObjectBase<Eigen::Matrix<std::complex<double>,10,10,0,10,10>> *)&V;
  local_3e10.m_matrix = (non_const_type)&scale;
  Eigen::internal::
  call_assignment<Eigen::Matrix<std::complex<double>,10,10,0,10,10>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<std::complex<double>,std::complex<double>>,Eigen::ArrayWrapper<Eigen::Matrix<std::complex<double>,10,10,0,10,10>>const,Eigen::ArrayWrapper<Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,10,1,0,10,1>>,Eigen::Transpose<Eigen::Matrix<std::complex<double>,10,1,0,10,1>>,0>const>const>>
            (&V,(CwiseBinaryOp<Eigen::internal::scalar_product_op<std::complex<double>,_std::complex<double>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>,_const_Eigen::ArrayWrapper<const_Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>_>,_Eigen::Transpose<Eigen::Matrix<std::complex<double>,_10,_1,_0,_10,_1>_>,_0>_>_>
                 *)local_3e28);
  local_3e10.m_matrix = (non_const_type)0x0;
  vStack_3e08.m_value = 0;
  local_3e00 = 1;
  local_3f40.
  super_BlockImpl<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>,_0>
  .m_data = V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.
            m_storage.m_data.array + 2;
  local_3f40.
  super_BlockImpl<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_true>.
  m_startRow.m_value = 2;
  local_3f40.
  super_BlockImpl<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_true>.
  m_startCol.m_value = 0;
  local_3f40.
  super_BlockImpl<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_true>.
  m_outerStride = 1;
  local_3f40.
  super_BlockImpl<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_true>.
  m_xpr = (XprTypeNested)&V;
  local_3e28._0_8_ = sols;
  local_3e18.m_other = (double)sols;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<std::complex<double>,4,10,0,4,10>,1,10,false>>
  ::CommaInitializer<Eigen::Block<Eigen::Matrix<std::complex<double>,10,10,0,10,10>,1,10,false>>
            (local_3d48,
             (Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false> *)local_3e28
             ,(DenseBase<Eigen::Block<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>,_1,_10,_false>_>
               *)&local_3f40);
  pcVar6 = (sols->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>_>).
           m_storage.m_data.array + 1;
  local_3e10.m_matrix = (non_const_type)0x1;
  vStack_3e08.m_value = 0;
  local_3e00 = 1;
  local_3f40.
  super_BlockImpl<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>,_0>
  .m_data = V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.
            m_storage.m_data.array + 8;
  local_3f40.
  super_BlockImpl<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_true>.
  m_startRow.m_value = 8;
  local_3f40.
  super_BlockImpl<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_true>.
  m_startCol.m_value = 0;
  local_3f40.
  super_BlockImpl<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_true>.
  m_outerStride = 1;
  local_3f40.
  super_BlockImpl<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_true>.
  m_xpr = (XprTypeNested)&V;
  local_3e28._0_8_ = pcVar6;
  local_3e18.m_other = (double)sols;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<std::complex<double>,4,10,0,4,10>,1,10,false>>
  ::CommaInitializer<Eigen::Block<Eigen::Matrix<std::complex<double>,10,10,0,10,10>,1,10,false>>
            (local_3d68,
             (Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false> *)local_3e28
             ,(DenseBase<Eigen::Block<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>,_1,_10,_false>_>
               *)&local_3f40);
  local_3e28._0_8_ =
       (sols->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>_>).
       m_storage.m_data.array + 2;
  local_3e10.m_matrix = (non_const_type)0x2;
  vStack_3e08.m_value = 0;
  local_3e00 = 1;
  local_3f40.
  super_BlockImpl<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>,_0>
  .m_data = (PointerType)&D;
  local_3e18.m_other = (double)sols;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<std::complex<double>,4,10,0,4,10>,1,10,false>>
  ::CommaInitializer<Eigen::Transpose<Eigen::Matrix<std::complex<double>,10,1,0,10,1>>>
            (local_3d88,
             (Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false> *)local_3e28
             ,(DenseBase<Eigen::Transpose<Eigen::Matrix<std::complex<double>,_10,_1,_0,_10,_1>_>_> *
              )&local_3f40);
  local_3f40.
  super_BlockImpl<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>,_0>
  .m_data = (sols->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>_>).
            m_storage.m_data.array + 3;
  local_3f40.
  super_BlockImpl<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_true>.
  m_startRow.m_value = 3;
  local_3f40.
  super_BlockImpl<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_true>.
  m_startCol.m_value = 0;
  local_3e28._0_8_ =
       V.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>.m_storage.
       m_data.array + 4;
  local_3e10.m_matrix = (non_const_type)0x4;
  vStack_3e08.m_value = 0;
  local_3e00 = 1;
  local_3de0 = 1;
  local_3dd8 = 0;
  local_3f40.
  super_BlockImpl<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_true>.
  m_outerStride = 1;
  local_3dd0 = 1;
  local_3dc0 = 0x4000000000000000;
  local_3f40.
  super_BlockImpl<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false,_true>.
  m_xpr = sols;
  local_3e18.m_other = (double)&V;
  local_3df8 = pcVar6;
  local_3de8 = sols;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<std::complex<double>,4,10,0,4,10>,1,10,false>>
  ::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,std::complex<double>>,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<std::complex<double>,10,10,0,10,10>,1,10,false>>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_pow_op<std::complex<double>,double>,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<std::complex<double>,4,10,0,4,10>,1,10,false>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,10,1,1,10>const>const>const>>
            (local_3da8,&local_3f40,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,_std::complex<double>_>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>,_1,_10,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_pow_op<std::complex<double>,_double>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_10,_1,_1,_10>_>_>_>_>
              *)local_3e28);
  Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~EigenSolver(&eig);
  return 0;
}

Assistant:

int solver_R7Pfr(Eigen::Matrix<double,35,1> const data, Eigen::Matrix<std::complex<double>,4,10> & sols){

Eigen::Matrix<double, 26, 26> C0;
Eigen::Matrix<double, 26, 10> C1;

setup_elimination_template(data, C0, C1);



C1 = C0.lu().solve(C1);



Eigen::Matrix<double, 17, 10> RR;

RR.topRows(7) = -C1.bottomRows(7);
RR.bottomRows(10) = Eigen::MatrixXd::Identity(10,10);

int ind[10] = {0,1,8,2,3,10,4,5,13,6};

Eigen::Matrix<double, 10, 10> AM;



for (int i = 0; i < 10; i++)
{
    AM.row(i) = RR.row(ind[i]);
}

Eigen::EigenSolver<Eigen::MatrixXd> eig(AM);
Eigen::Matrix<std::complex<double>,10,1> D = eig.eigenvalues();
Eigen::Matrix<std::complex<double>,10,10> V = eig.eigenvectors();


Eigen::Matrix<std::complex<double>,10,1> scale = D.array()/V.row(9).array().transpose();

V = V.array() * (Eigen::Matrix<double,10,1>::Ones() * scale.transpose()).array();


sols.row(0) << V.row(2);
sols.row(1) << V.row(8);
sols.row(2) << D.transpose();
sols.row(3) << V.row(4).array() / sols.row(1).array().pow(2);
return 0;
}